

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O0

char * sfts_read_keystring0(sfts_t *f,char *key)

{
  int iVar1;
  undefined8 in_RSI;
  char *ret;
  sfkey_t k;
  char *local_38;
  undefined8 local_30;
  undefined1 local_28;
  char *local_20;
  undefined8 local_10;
  
  local_10 = in_RSI;
  memset(&local_30,0,0x20);
  local_38 = (char *)g_malloc0(0x51);
  local_30 = local_10;
  local_28 = 0x53;
  local_20 = local_38;
  iVar1 = sfts_read_keymaybe((sfts_t *)k.v.s,(sfkey_t *)k._8_8_);
  if (iVar1 != 1) {
    g_free(local_38);
    local_38 = (char *)0x0;
  }
  return local_38;
}

Assistant:

char *sfts_read_keystring0(sfts_t *f, const char *key) {
    sfkey_t k = {.c = NULL };
    char *ret = (char *) g_malloc0(SKEY_LEN);
    k.k = key, k.t = 'S', k.v.s = ret;
    if (sfts_read_keymaybe(f, &k) != 1) {
        g_free(ret);
        ret = NULL;
    }

    return ret;
}